

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void set_results(double *results,int row,int p,int d,int q,int P,int D,int Q,int constant,double ic)

{
  int in_stack_00000008;
  
  results[row * 8 - 8] = (double)p;
  results[row * 8 - 7] = (double)d;
  results[row * 8 - 6] = (double)q;
  results[row * 8 - 5] = (double)P;
  results[row * 8 - 4] = (double)in_stack_00000008;
  results[row * 8 - 3] = (double)D;
  results[row * 8 - 2] = (double)Q;
  results[row * 8 - 1] = ic;
  return;
}

Assistant:

static void set_results(double *results, int row, int p, int d, int q, int P, int D, int Q, int constant, double ic) {
	int index;

	index = 8 * (row-1);

	results[index] = (double) p;
	results[index+1] = (double) d;
	results[index+2] = (double) q;
	results[index+3] = (double) P;
	results[index+4] = (double) D;
	results[index+5] = (double) Q;
	results[index+6] = (double) constant;
	results[index+7] = ic;
}